

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave.c
# Opt level: O0

void list_object(chunk_conflict *c,object *obj)

{
  int iVar1;
  object **ppoVar2;
  uint local_1c;
  wchar_t newsize;
  wchar_t i;
  object *obj_local;
  chunk_conflict *c_local;
  
  if (obj != (object *)0x0) {
    for (local_1c = 1; (int)local_1c < (int)(uint)c->obj_max; local_1c = local_1c + 1) {
      if (c->objects[(int)local_1c] == obj) {
        return;
      }
    }
    for (local_1c = 1; (int)local_1c < (int)(uint)c->obj_max; local_1c = local_1c + 1) {
      if ((((c != cave) || (player->cave == (chunk_conflict1 *)0x0)) ||
          (player->cave->objects[(int)local_1c] == (object *)0x0)) &&
         (c->objects[(int)local_1c] == (object *)0x0)) {
        c->objects[(int)local_1c] = obj;
        obj->oidx = (uint16_t)local_1c;
        return;
      }
    }
    iVar1 = (c->obj_max + 0x81) * 8;
    ppoVar2 = (object **)mem_realloc(c->objects,(long)iVar1);
    c->objects = ppoVar2;
    c->objects[c->obj_max] = obj;
    obj->oidx = c->obj_max;
    local_1c = (uint)c->obj_max;
    while (local_1c = local_1c + 1, (int)local_1c <= (int)(c->obj_max + 0x80)) {
      c->objects[(int)local_1c] = (object *)0x0;
    }
    c->obj_max = c->obj_max + 0x80;
    if ((c == cave) && (player->cave != (chunk_conflict1 *)0x0)) {
      ppoVar2 = (object **)mem_realloc(player->cave->objects,(long)iVar1);
      player->cave->objects = ppoVar2;
      for (local_1c = (uint)player->cave->obj_max; (int)local_1c <= (int)(uint)c->obj_max;
          local_1c = local_1c + 1) {
        player->cave->objects[(int)local_1c] = (object *)0x0;
      }
      player->cave->obj_max = c->obj_max;
    }
  }
  return;
}

Assistant:

void list_object(struct chunk *c, struct object *obj)
{
	int i, newsize;

	/* Check for duplicates and objects already deleted or combined */
	if (!obj) return;
	for (i = 1; i < c->obj_max; i++)
		if (c->objects[i] == obj)
			return;

	/* Put objects in holes in the object list */
	for (i = 1; i < c->obj_max; i++) {
		/* If there is a known object, skip this slot */
		if ((c == cave) && player->cave && player->cave->objects[i]) {
			continue;
		}

		/* Put the object in a hole */
		if (c->objects[i] == NULL) {
			c->objects[i] = obj;
			obj->oidx = i;
			return;
		}
	}

	/* Extend the list */
	newsize = (c->obj_max + OBJECT_LIST_INCR + 1) * sizeof(struct object*);
	c->objects = mem_realloc(c->objects, newsize);
	c->objects[c->obj_max] = obj;
	obj->oidx = c->obj_max;
	for (i = c->obj_max + 1; i <= c->obj_max + OBJECT_LIST_INCR; i++)
		c->objects[i] = NULL;
	c->obj_max += OBJECT_LIST_INCR;

	/* If we're on the current level, extend the known list */
	if ((c == cave) && player->cave) {
		player->cave->objects = mem_realloc(player->cave->objects, newsize);
		for (i = player->cave->obj_max; i <= c->obj_max; i++)
			player->cave->objects[i] = NULL;
		player->cave->obj_max = c->obj_max;
	}
}